

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADAFWTextureCoordinateBinding.h
# Opt level: O0

void __thiscall
COLLADAFW::TextureCoordinateBinding::~TextureCoordinateBinding(TextureCoordinateBinding *this)

{
  void *in_RDI;
  
  ~TextureCoordinateBinding((TextureCoordinateBinding *)0xc45ca8);
  operator_delete(in_RDI,0x38);
  return;
}

Assistant:

virtual ~TextureCoordinateBinding() {}